

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_store_statement
          (CompilerMSL *this,uint32_t lhs_expression,uint32_t rhs_expression)

{
  bool bVar1;
  uint32_t uVar2;
  CompilerError *this_00;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  SPIRType *pSVar5;
  uint32_t id;
  byte local_b11;
  byte local_ad9;
  undefined1 local_ad8 [8];
  string rhs_1;
  undefined1 local_ab8 [8];
  string lhs_1;
  undefined1 local_a98 [64];
  spirv_cross local_a58 [32];
  undefined1 local_a38 [8];
  string rhs;
  undefined1 local_a18 [8];
  string lhs;
  undefined1 local_9f8 [72];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0 [32];
  string *local_990;
  size_type column_index_1;
  string lhs_expr_1;
  uint local_964;
  undefined1 local_960 [4];
  uint32_t c_1;
  SPIRType write_type_1;
  undefined1 local_7f0 [40];
  undefined1 local_7c8 [4];
  uint32_t i_3;
  spirv_cross local_7a8 [32];
  undefined1 local_788 [8];
  string unpacked_expr;
  uint local_764;
  undefined1 local_760 [4];
  uint32_t j_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740 [8];
  string rhs_row_1;
  uint local_71c;
  undefined1 local_718 [4];
  uint32_t i_2;
  SPIRType vector_type_1;
  spirv_cross local_5a8 [32];
  undefined1 local_588 [32];
  undefined1 local_568 [68];
  uint local_524;
  undefined1 local_520 [4];
  uint32_t j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500 [8];
  string rhs_row;
  uint local_4dc;
  undefined1 local_4d8 [4];
  uint32_t i_1;
  SPIRType vector_type;
  undefined1 local_368 [44];
  uint32_t i;
  spirv_cross local_320 [32];
  string local_300 [8];
  string cast_expr;
  undefined1 local_2e0 [8];
  SPIRType write_type;
  char *pcStack_188;
  bool rhs_transpose;
  char *packed_pfx;
  SPIRType *physical_type;
  undefined1 local_170 [4];
  TypeID physical_type_id;
  char local_14a [2];
  spirv_cross local_148 [40];
  size_type column_index;
  string lhs_expr;
  uint local_fc;
  undefined1 local_f8 [4];
  uint32_t c;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [56];
  string local_60 [39];
  byte local_39;
  __node_base _Stack_38;
  bool transpose;
  SPIRExpression *rhs_e;
  SPIRExpression *lhs_e;
  bool lhs_packed_type;
  __node_base _Stack_20;
  bool lhs_remapped_type;
  SPIRType *type;
  uint32_t rhs_expression_local;
  uint32_t lhs_expression_local;
  CompilerMSL *this_local;
  
  type._0_4_ = rhs_expression;
  type._4_4_ = lhs_expression;
  _rhs_expression_local = (_Hash_node_base *)this;
  _Stack_20._M_nxt = (_Hash_node_base *)Compiler::expression_type((Compiler *)this,rhs_expression);
  lhs_e._7_1_ = Compiler::has_extended_decoration
                          ((Compiler *)this,type._4_4_,SPIRVCrossDecorationPhysicalTypeID);
  lhs_e._6_1_ = Compiler::has_extended_decoration
                          ((Compiler *)this,type._4_4_,SPIRVCrossDecorationPhysicalTypePacked);
  rhs_e = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,type._4_4_);
  _Stack_38._M_nxt =
       (_Hash_node_base *)
       Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,(uint32_t)type);
  local_ad9 = 0;
  if (rhs_e != (SPIRExpression *)0x0) {
    local_ad9 = rhs_e->need_transpose;
  }
  local_39 = local_ad9 & 1;
  id = (uint32_t)this;
  if (((lhs_e._7_1_ & 1) == 0) && ((lhs_e._6_1_ & 1) == 0)) {
    bVar1 = Compiler::is_matrix((Compiler *)this,(SPIRType *)_Stack_20._M_nxt);
    if (((bVar1) && (rhs_e != (SPIRExpression *)0x0)) && ((rhs_e->need_transpose & 1U) != 0)) {
      if ((SPIRExpression *)_Stack_38._M_nxt == (SPIRExpression *)0x0) {
        local_98[0x23] = '\x01';
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_60,
                   "Need to transpose right-side expression of a store to row-major matrix, but it is not a SPIRExpression."
                   ,(allocator *)(local_98 + 0x37));
        CompilerError::CompilerError(this_00,(string *)local_60);
        local_98[0x23] = '\0';
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      rhs_e->need_transpose = false;
      if (((SPIRExpression *)_Stack_38._M_nxt == (SPIRExpression *)0x0) ||
         ((*(bool *)((long)(_Stack_38._M_nxt + 7) + 1) & 1U) == 0)) {
        CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_d8,id,SUB41(type._4_4_,0));
        CompilerGLSL::to_unpacked_expression_abi_cxx11_
                  ((CompilerGLSL *)local_f8,id,SUB41((uint32_t)type,0));
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[14],std::__cxx11::string,char_const(&)[3]>
                  (&this->super_CompilerGLSL,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   (char (*) [14])" = transpose(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   (char (*) [3])0x4d9ce1);
        ::std::__cxx11::string::~string((string *)local_f8);
        ::std::__cxx11::string::~string((string *)local_d8);
      }
      else {
        *(bool *)((long)(_Stack_38._M_nxt + 7) + 1) = false;
        CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_98,id,SUB41(type._4_4_,0));
        CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                  ((CompilerGLSL *)local_b8,id);
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   (char (*) [4])0x4f38c2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   (char (*) [2])0x4d9ce2);
        ::std::__cxx11::string::~string((string *)local_b8);
        ::std::__cxx11::string::~string((string *)local_98);
        *(bool *)((long)(_Stack_38._M_nxt + 7) + 1) = true;
      }
      rhs_e->need_transpose = true;
      Compiler::register_write((Compiler *)this,type._4_4_);
    }
    else if ((rhs_e == (SPIRExpression *)0x0) || ((rhs_e->need_transpose & 1U) == 0)) {
      CompilerGLSL::emit_store_statement(&this->super_CompilerGLSL,type._4_4_,(uint32_t)type);
    }
    else {
      rhs_e->need_transpose = false;
      for (local_fc = 0; local_fc < *(uint32_t *)((long)(_Stack_20._M_nxt + 2) + 4);
          local_fc = local_fc + 1) {
        CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                  ((CompilerGLSL *)&column_index,id,SUB41(type._4_4_,0));
        psVar3 = (string *)::std::__cxx11::string::find_last_of((char)&column_index,0x5b);
        local_148._32_8_ = psVar3;
        if (psVar3 != (string *)0xffffffffffffffff) {
          local_14a[1] = 0x5b;
          local_14a[0] = 0x5d;
          join<char,unsigned_int&,char>(local_148,local_14a + 1,&local_fc,local_14a);
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ::std::__cxx11::string::insert((ulong)&column_index,psVar3);
          CompilerGLSL::to_extract_component_expression_abi_cxx11_
                    ((CompilerGLSL *)local_170,id,(uint32_t)type);
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,pbVar4,(char (*) [4])0x4f38c2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                     (char (*) [2])0x4d9ce2);
          ::std::__cxx11::string::~string((string *)local_170);
          ::std::__cxx11::string::~string((string *)local_148);
        }
        ::std::__cxx11::string::~string((string *)&column_index);
      }
      rhs_e->need_transpose = true;
      Compiler::register_write((Compiler *)this,type._4_4_);
    }
  }
  else if (((lhs_e._7_1_ & 1) != 0) ||
          ((bVar1 = Compiler::is_matrix((Compiler *)this,(SPIRType *)_Stack_20._M_nxt), bVar1 ||
           ((local_39 & 1) != 0)))) {
    if ((lhs_e._7_1_ & 1) == 0) {
      physical_type._0_4_ = ((ID *)(_Stack_20._M_nxt + 1))->id;
    }
    else {
      uVar2 = Compiler::get_extended_decoration
                        ((Compiler *)this,type._4_4_,SPIRVCrossDecorationPhysicalTypeID);
      TypedID<(spirv_cross::Types)0>::TypedID
                ((TypedID<(spirv_cross::Types)0> *)&physical_type,uVar2);
    }
    physical_type._4_4_ = TypedID::operator_cast_to_TypedID((TypedID *)&physical_type);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&physical_type + 4));
    packed_pfx = (char *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
    bVar1 = Compiler::is_matrix((Compiler *)this,(SPIRType *)_Stack_20._M_nxt);
    if (bVar1) {
      pcStack_188 = "";
      if ((lhs_e._6_1_ & 1) != 0) {
        pcStack_188 = "packed_";
      }
      local_b11 = 0;
      if ((SPIRExpression *)_Stack_38._M_nxt != (SPIRExpression *)0x0) {
        local_b11 = *(bool *)((long)(_Stack_38._M_nxt + 7) + 1);
      }
      write_type.member_name_cache._M_h._M_single_bucket._7_1_ = local_b11 & 1;
      SPIRType::SPIRType((SPIRType *)local_2e0,(SPIRType *)_Stack_20._M_nxt);
      ::std::__cxx11::string::string(local_300);
      if ((write_type.member_name_cache._M_h._M_single_bucket._7_1_ & 1) != 0) {
        *(bool *)((long)(_Stack_38._M_nxt + 7) + 1) = false;
      }
      if ((local_39 & 1) == 0) {
        write_type.width = 1;
        if (*(uint32_t *)(packed_pfx + 0x14) != *(uint32_t *)((long)(_Stack_20._M_nxt + 2) + 4)) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&vector_type_1.member_name_cache._M_h._M_single_bucket,this,local_2e0,0);
          join<char_const(&)[9],char_const*&,std::__cxx11::string,char_const(&)[3]>
                    (local_5a8,(char (*) [9])0x4e9730,&stack0xfffffffffffffe78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type_1.member_name_cache._M_h._M_single_bucket,(char (*) [3])0x4df903);
          ::std::__cxx11::string::operator=(local_300,(string *)local_5a8);
          ::std::__cxx11::string::~string((string *)local_5a8);
          ::std::__cxx11::string::~string
                    ((string *)&vector_type_1.member_name_cache._M_h._M_single_bucket);
        }
        if ((write_type.member_name_cache._M_h._M_single_bucket._7_1_ & 1) == 0) {
          for (local_7f0._36_4_ = 0; (uint)local_7f0._36_4_ < *(uint *)(_Stack_20._M_nxt + 3);
              local_7f0._36_4_ = local_7f0._36_4_ + 1) {
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      ((CompilerGLSL *)local_7f0,id,SUB41(type._4_4_,0));
            CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                      ((CompilerGLSL *)&write_type_1.member_name_cache._M_h._M_single_bucket,id,
                       SUB41((uint32_t)type,0));
            CompilerGLSL::
            statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                      (&this->super_CompilerGLSL,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_300,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_7f0,(char (*) [2])0x4f1699,(uint *)(local_7f0 + 0x24),
                       (char (*) [2])0x4e3676,(char (*) [4])0x4f38c2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &write_type_1.member_name_cache._M_h._M_single_bucket,(char (*) [2])0x4f1699,
                       (uint *)(local_7f0 + 0x24),(char (*) [3])0x4e2232);
            ::std::__cxx11::string::~string
                      ((string *)&write_type_1.member_name_cache._M_h._M_single_bucket);
            ::std::__cxx11::string::~string((string *)local_7f0);
          }
        }
        else {
          pSVar5 = Compiler::expression_type((Compiler *)this,(uint32_t)type);
          SPIRType::SPIRType((SPIRType *)local_718,pSVar5);
          vector_type_1.width = 1;
          for (local_71c = 0; local_71c < *(uint *)(_Stack_20._M_nxt + 3); local_71c = local_71c + 1
              ) {
            CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
                      ((CompilerGLSL *)local_760,(SPIRType *)this);
            ::std::operator+(local_740,local_760);
            ::std::__cxx11::string::~string((string *)local_760);
            for (local_764 = 0; local_764 < (uint)vector_type_1.super_IVariant._12_4_;
                local_764 = local_764 + 1) {
              CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                        ((CompilerGLSL *)local_788,id);
              join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                        (local_7a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_788,(char (*) [2])0x4f1699,&local_764,(char (*) [3])"][",&local_71c,
                         (char (*) [2])0x4e3676);
              ::std::__cxx11::string::operator+=((string *)local_740,(string *)local_7a8);
              ::std::__cxx11::string::~string((string *)local_7a8);
              if (local_764 + 1 < (uint)vector_type_1.super_IVariant._12_4_) {
                ::std::__cxx11::string::operator+=((string *)local_740,", ");
              }
              ::std::__cxx11::string::~string((string *)local_788);
            }
            ::std::__cxx11::string::operator+=((string *)local_740,")");
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      ((CompilerGLSL *)local_7c8,id,SUB41(type._4_4_,0));
            CompilerGLSL::
            statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_300,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_7c8,(char (*) [2])0x4f1699,&local_71c,(char (*) [2])0x4e3676,
                       (char (*) [4])0x4f38c2,local_740,(char (*) [2])0x4d9ce2);
            ::std::__cxx11::string::~string((string *)local_7c8);
            ::std::__cxx11::string::~string((string *)local_740);
          }
          SPIRType::~SPIRType((SPIRType *)local_718);
        }
      }
      else {
        rhs_e->need_transpose = false;
        write_type.super_IVariant._12_4_ = *(undefined4 *)(_Stack_20._M_nxt + 3);
        write_type.width = 1;
        if (*(uint32_t *)(packed_pfx + 0x18) != *(uint32_t *)(_Stack_20._M_nxt + 3)) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_368 + 0x28,this,local_2e0,0);
          join<char_const(&)[9],char_const*&,std::__cxx11::string,char_const(&)[3]>
                    (local_320,(char (*) [9])0x4e9730,&stack0xfffffffffffffe78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_368 + 0x28),(char (*) [3])0x4df903);
          ::std::__cxx11::string::operator=(local_300,(string *)local_320);
          ::std::__cxx11::string::~string((string *)local_320);
          ::std::__cxx11::string::~string((string *)(local_368 + 0x28));
        }
        if ((write_type.member_name_cache._M_h._M_single_bucket._7_1_ & 1) == 0) {
          pSVar5 = Compiler::expression_type((Compiler *)this,(uint32_t)type);
          SPIRType::SPIRType((SPIRType *)local_4d8,pSVar5);
          vector_type.super_IVariant._12_4_ = vector_type.width;
          vector_type.width = 1;
          for (local_4dc = 0; local_4dc < *(uint32_t *)((long)(_Stack_20._M_nxt + 2) + 4);
              local_4dc = local_4dc + 1) {
            CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
                      ((CompilerGLSL *)local_520,(SPIRType *)this);
            ::std::operator+(local_500,local_520);
            ::std::__cxx11::string::~string((string *)local_520);
            for (local_524 = 0; local_524 < (uint)vector_type.super_IVariant._12_4_;
                local_524 = local_524 + 1) {
              CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                        ((CompilerGLSL *)local_568,id,SUB41((uint32_t)type,0));
              join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                        ((spirv_cross *)(local_568 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_568,(char (*) [2])0x4f1699,&local_524,(char (*) [3])"][",&local_4dc,
                         (char (*) [2])0x4e3676);
              ::std::__cxx11::string::operator+=((string *)local_500,(string *)(local_568 + 0x20));
              ::std::__cxx11::string::~string((string *)(local_568 + 0x20));
              ::std::__cxx11::string::~string((string *)local_568);
              if (local_524 + 1 < (uint)vector_type.super_IVariant._12_4_) {
                ::std::__cxx11::string::operator+=((string *)local_500,", ");
              }
            }
            ::std::__cxx11::string::operator+=((string *)local_500,")");
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      ((CompilerGLSL *)local_588,id,SUB41(type._4_4_,0));
            CompilerGLSL::
            statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_300,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_588,(char (*) [2])0x4f1699,&local_4dc,(char (*) [2])0x4e3676,
                       (char (*) [4])0x4f38c2,local_500,(char (*) [2])0x4d9ce2);
            ::std::__cxx11::string::~string((string *)local_588);
            ::std::__cxx11::string::~string((string *)local_500);
          }
          SPIRType::~SPIRType((SPIRType *)local_4d8);
        }
        else {
          for (local_368._36_4_ = 0;
              (uint)local_368._36_4_ < *(uint32_t *)((long)(_Stack_20._M_nxt + 2) + 4);
              local_368._36_4_ = local_368._36_4_ + 1) {
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      ((CompilerGLSL *)local_368,id,SUB41(type._4_4_,0));
            CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                      ((CompilerGLSL *)&vector_type.member_name_cache._M_h._M_single_bucket,id);
            CompilerGLSL::
            statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                      (&this->super_CompilerGLSL,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_300,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_368,(char (*) [2])0x4f1699,(uint *)(local_368 + 0x24),
                       (char (*) [2])0x4e3676,(char (*) [4])0x4f38c2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vector_type.member_name_cache._M_h._M_single_bucket,(char (*) [2])0x4f1699,
                       (uint *)(local_368 + 0x24),(char (*) [3])0x4e2232);
            ::std::__cxx11::string::~string
                      ((string *)&vector_type.member_name_cache._M_h._M_single_bucket);
            ::std::__cxx11::string::~string((string *)local_368);
          }
        }
        rhs_e->need_transpose = true;
      }
      if ((write_type.member_name_cache._M_h._M_single_bucket._7_1_ & 1) != 0) {
        *(bool *)((long)(_Stack_38._M_nxt + 7) + 1) = true;
      }
      ::std::__cxx11::string::~string(local_300);
      SPIRType::~SPIRType((SPIRType *)local_2e0);
    }
    else if ((local_39 & 1) == 0) {
      bVar1 = Compiler::is_matrix((Compiler *)this,(SPIRType *)packed_pfx);
      if (((bVar1) || (bVar1 = Compiler::is_array((Compiler *)this,(SPIRType *)packed_pfx), bVar1))
         && (*(uint32_t *)((long)(_Stack_20._M_nxt + 2) + 4) < *(uint *)(packed_pfx + 0x14))) {
        bVar1 = false;
        if (*(uint32_t *)((long)(_Stack_20._M_nxt + 2) + 4) != 0) {
          bVar1 = *(uint32_t *)((long)(_Stack_20._M_nxt + 2) + 4) < 4;
        }
        if (!bVar1) {
          __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0xebd,
                        "virtual void spirv_cross::CompilerMSL::emit_store_statement(uint32_t, uint32_t)"
                       );
        }
        if (((lhs_e._6_1_ ^ 0xff) & 1) == 0) {
          __assert_fail("!lhs_packed_type",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0xec3,
                        "virtual void spirv_cross::CompilerMSL::emit_store_statement(uint32_t, uint32_t)"
                       );
        }
        CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                  ((CompilerGLSL *)local_a18,id,SUB41(type._4_4_,0));
        CompilerGLSL::to_pointer_expression_abi_cxx11_
                  ((CompilerGLSL *)local_a38,id,SUB41((uint32_t)type,0));
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_a98 + 0x20,this,_Stack_20._M_nxt,0);
        CompilerGLSL::enclose_expression((CompilerGLSL *)local_a98,(string *)this);
        join<char_const(&)[9],std::__cxx11::string,char_const(&)[3],std::__cxx11::string>
                  (local_a58,(char (*) [9])0x4e9730,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_a98 + 0x20),(char (*) [3])0x4df903,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a98);
        ::std::__cxx11::string::operator=((string *)local_a18,(string *)local_a58);
        ::std::__cxx11::string::~string((string *)local_a58);
        ::std::__cxx11::string::~string((string *)local_a98);
        ::std::__cxx11::string::~string((string *)(local_a98 + 0x20));
        pSVar5 = Compiler::expression_type((Compiler *)this,(uint32_t)type);
        bVar1 = CompilerGLSL::optimize_read_modify_write
                          (&this->super_CompilerGLSL,pSVar5,(string *)local_a18,(string *)local_a38)
        ;
        if (!bVar1) {
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a18,
                     (char (*) [4])0x4f38c2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a38,
                     (char (*) [2])0x4d9ce2);
        }
        ::std::__cxx11::string::~string((string *)local_a38);
        ::std::__cxx11::string::~string((string *)local_a18);
      }
      else {
        bVar1 = Compiler::is_matrix((Compiler *)this,(SPIRType *)_Stack_20._M_nxt);
        if (!bVar1) {
          CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                    ((CompilerGLSL *)local_ab8,id,SUB41(type._4_4_,0));
          CompilerGLSL::to_pointer_expression_abi_cxx11_
                    ((CompilerGLSL *)local_ad8,id,SUB41((uint32_t)type,0));
          pSVar5 = Compiler::expression_type((Compiler *)this,(uint32_t)type);
          bVar1 = CompilerGLSL::optimize_read_modify_write
                            (&this->super_CompilerGLSL,pSVar5,(string *)local_ab8,
                             (string *)local_ad8);
          if (!bVar1) {
            CompilerGLSL::
            statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_ab8,(char (*) [4])0x4f38c2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_ad8,(char (*) [2])0x4d9ce2);
          }
          ::std::__cxx11::string::~string((string *)local_ad8);
          ::std::__cxx11::string::~string((string *)local_ab8);
        }
      }
    }
    else {
      rhs_e->need_transpose = false;
      SPIRType::SPIRType((SPIRType *)local_960,(SPIRType *)_Stack_20._M_nxt);
      write_type_1.super_IVariant._12_4_ = 1;
      write_type_1.width = 1;
      for (local_964 = 0; local_964 < *(uint32_t *)((long)(_Stack_20._M_nxt + 2) + 4);
          local_964 = local_964 + 1) {
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  ((CompilerGLSL *)&column_index_1,id,SUB41(type._4_4_,0));
        local_990 = (string *)::std::__cxx11::string::find_last_of((char)&column_index_1,0x5b);
        if (local_990 != (string *)0xffffffffffffffff) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_9b0,this,local_960,0);
          psVar3 = local_990;
          local_9f8[0x27] = '[';
          local_9f8[0x26] = ']';
          join<char,unsigned_int&,char,char_const(&)[2]>
                    ((spirv_cross *)(local_9f8 + 0x28),local_9f8 + 0x27,&local_964,local_9f8 + 0x26,
                     (char (*) [2])0x4dff7a);
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ::std::__cxx11::string::insert((ulong)&column_index_1,psVar3);
          CompilerGLSL::to_extract_component_expression_abi_cxx11_
                    ((CompilerGLSL *)local_9f8,id,(uint32_t)type);
          CompilerGLSL::
          statement<char_const(&)[10],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [10])"((device ",local_9b0,
                     (char (*) [4])"*)&",pbVar4,(char (*) [4])0x4f38c2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f8,
                     (char (*) [2])0x4d9ce2);
          ::std::__cxx11::string::~string((string *)local_9f8);
          ::std::__cxx11::string::~string((string *)(local_9f8 + 0x28));
          ::std::__cxx11::string::~string((string *)local_9b0);
        }
        ::std::__cxx11::string::~string((string *)&column_index_1);
      }
      rhs_e->need_transpose = true;
      SPIRType::~SPIRType((SPIRType *)local_960);
    }
    Compiler::register_write((Compiler *)this,type._4_4_);
  }
  else {
    CompilerGLSL::emit_store_statement(&this->super_CompilerGLSL,type._4_4_,(uint32_t)type);
  }
  return;
}

Assistant:

void CompilerMSL::emit_store_statement(uint32_t lhs_expression, uint32_t rhs_expression)
{
	auto &type = expression_type(rhs_expression);

	bool lhs_remapped_type = has_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypeID);
	bool lhs_packed_type = has_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypePacked);
	auto *lhs_e = maybe_get<SPIRExpression>(lhs_expression);
	auto *rhs_e = maybe_get<SPIRExpression>(rhs_expression);

	bool transpose = lhs_e && lhs_e->need_transpose;

	// No physical type remapping, and no packed type, so can just emit a store directly.
	if (!lhs_remapped_type && !lhs_packed_type)
	{
		// We might not be dealing with remapped physical types or packed types,
		// but we might be doing a clean store to a row-major matrix.
		// In this case, we just flip transpose states, and emit the store, a transpose must be in the RHS expression, if any.
		if (is_matrix(type) && lhs_e && lhs_e->need_transpose)
		{
			if (!rhs_e)
				SPIRV_CROSS_THROW("Need to transpose right-side expression of a store to row-major matrix, but it is "
				                  "not a SPIRExpression.");
			lhs_e->need_transpose = false;

			if (rhs_e && rhs_e->need_transpose)
			{
				// Direct copy, but might need to unpack RHS.
				// Skip the transpose, as we will transpose when writing to LHS and transpose(transpose(T)) == T.
				rhs_e->need_transpose = false;
				statement(to_expression(lhs_expression), " = ", to_unpacked_row_major_matrix_expression(rhs_expression),
				          ";");
				rhs_e->need_transpose = true;
			}
			else
				statement(to_expression(lhs_expression), " = transpose(", to_unpacked_expression(rhs_expression), ");");

			lhs_e->need_transpose = true;
			register_write(lhs_expression);
		}
		else if (lhs_e && lhs_e->need_transpose)
		{
			lhs_e->need_transpose = false;

			// Storing a column to a row-major matrix. Unroll the write.
			for (uint32_t c = 0; c < type.vecsize; c++)
			{
				auto lhs_expr = to_dereferenced_expression(lhs_expression);
				auto column_index = lhs_expr.find_last_of('[');
				if (column_index != string::npos)
				{
					statement(lhs_expr.insert(column_index, join('[', c, ']')), " = ",
					          to_extract_component_expression(rhs_expression, c), ";");
				}
			}
			lhs_e->need_transpose = true;
			register_write(lhs_expression);
		}
		else
			CompilerGLSL::emit_store_statement(lhs_expression, rhs_expression);
	}
	else if (!lhs_remapped_type && !is_matrix(type) && !transpose)
	{
		// Even if the target type is packed, we can directly store to it. We cannot store to packed matrices directly,
		// since they are declared as array of vectors instead, and we need the fallback path below.
		CompilerGLSL::emit_store_statement(lhs_expression, rhs_expression);
	}
	else
	{
		// Special handling when storing to a remapped physical type.
		// This is mostly to deal with std140 padded matrices or vectors.

		TypeID physical_type_id = lhs_remapped_type ?
		                              ID(get_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypeID)) :
		                              type.self;

		auto &physical_type = get<SPIRType>(physical_type_id);

		if (is_matrix(type))
		{
			const char *packed_pfx = lhs_packed_type ? "packed_" : "";

			// Packed matrices are stored as arrays of packed vectors, so we need
			// to assign the vectors one at a time.
			// For row-major matrices, we need to transpose the *right-hand* side,
			// not the left-hand side.

			// Lots of cases to cover here ...

			bool rhs_transpose = rhs_e && rhs_e->need_transpose;
			SPIRType write_type = type;
			string cast_expr;

			// We're dealing with transpose manually.
			if (rhs_transpose)
				rhs_e->need_transpose = false;

			if (transpose)
			{
				// We're dealing with transpose manually.
				lhs_e->need_transpose = false;
				write_type.vecsize = type.columns;
				write_type.columns = 1;

				if (physical_type.columns != type.columns)
					cast_expr = join("(device ", packed_pfx, type_to_glsl(write_type), "&)");

				if (rhs_transpose)
				{
					// If RHS is also transposed, we can just copy row by row.
					for (uint32_t i = 0; i < type.vecsize; i++)
					{
						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ",
						          to_unpacked_row_major_matrix_expression(rhs_expression), "[", i, "];");
					}
				}
				else
				{
					auto vector_type = expression_type(rhs_expression);
					vector_type.vecsize = vector_type.columns;
					vector_type.columns = 1;

					// Transpose on the fly. Emitting a lot of full transpose() ops and extracting lanes seems very bad,
					// so pick out individual components instead.
					for (uint32_t i = 0; i < type.vecsize; i++)
					{
						string rhs_row = type_to_glsl_constructor(vector_type) + "(";
						for (uint32_t j = 0; j < vector_type.vecsize; j++)
						{
							rhs_row += join(to_enclosed_unpacked_expression(rhs_expression), "[", j, "][", i, "]");
							if (j + 1 < vector_type.vecsize)
								rhs_row += ", ";
						}
						rhs_row += ")";

						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ", rhs_row, ";");
					}
				}

				// We're dealing with transpose manually.
				lhs_e->need_transpose = true;
			}
			else
			{
				write_type.columns = 1;

				if (physical_type.vecsize != type.vecsize)
					cast_expr = join("(device ", packed_pfx, type_to_glsl(write_type), "&)");

				if (rhs_transpose)
				{
					auto vector_type = expression_type(rhs_expression);
					vector_type.columns = 1;

					// Transpose on the fly. Emitting a lot of full transpose() ops and extracting lanes seems very bad,
					// so pick out individual components instead.
					for (uint32_t i = 0; i < type.columns; i++)
					{
						string rhs_row = type_to_glsl_constructor(vector_type) + "(";
						for (uint32_t j = 0; j < vector_type.vecsize; j++)
						{
							// Need to explicitly unpack expression since we've mucked with transpose state.
							auto unpacked_expr = to_unpacked_row_major_matrix_expression(rhs_expression);
							rhs_row += join(unpacked_expr, "[", j, "][", i, "]");
							if (j + 1 < vector_type.vecsize)
								rhs_row += ", ";
						}
						rhs_row += ")";

						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ", rhs_row, ";");
					}
				}
				else
				{
					// Copy column-by-column.
					for (uint32_t i = 0; i < type.columns; i++)
					{
						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ",
						          to_enclosed_unpacked_expression(rhs_expression), "[", i, "];");
					}
				}
			}

			// We're dealing with transpose manually.
			if (rhs_transpose)
				rhs_e->need_transpose = true;
		}
		else if (transpose)
		{
			lhs_e->need_transpose = false;

			SPIRType write_type = type;
			write_type.vecsize = 1;
			write_type.columns = 1;

			// Storing a column to a row-major matrix. Unroll the write.
			for (uint32_t c = 0; c < type.vecsize; c++)
			{
				auto lhs_expr = to_enclosed_expression(lhs_expression);
				auto column_index = lhs_expr.find_last_of('[');
				if (column_index != string::npos)
				{
					statement("((device ", type_to_glsl(write_type), "*)&",
					          lhs_expr.insert(column_index, join('[', c, ']', ")")), " = ",
					          to_extract_component_expression(rhs_expression, c), ";");
				}
			}

			lhs_e->need_transpose = true;
		}
		else if ((is_matrix(physical_type) || is_array(physical_type)) && physical_type.vecsize > type.vecsize)
		{
			assert(type.vecsize >= 1 && type.vecsize <= 3);

			// If we have packed types, we cannot use swizzled stores.
			// We could technically unroll the store for each element if needed.
			// When remapping to a std140 physical type, we always get float4,
			// and the packed decoration should always be removed.
			assert(!lhs_packed_type);

			string lhs = to_dereferenced_expression(lhs_expression);
			string rhs = to_pointer_expression(rhs_expression);

			// Unpack the expression so we can store to it with a float or float2.
			// It's still an l-value, so it's fine. Most other unpacking of expressions turn them into r-values instead.
			lhs = join("(device ", type_to_glsl(type), "&)", enclose_expression(lhs));
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}
		else if (!is_matrix(type))
		{
			string lhs = to_dereferenced_expression(lhs_expression);
			string rhs = to_pointer_expression(rhs_expression);
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}

		register_write(lhs_expression);
	}
}